

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::string_replace
          (t_rs_generator *this,string *target,string *search_string,string *replace_string)

{
  ulong uVar1;
  string *psVar2;
  size_t match_idx;
  size_t search_idx;
  size_t replace_len;
  size_t match_len;
  string *replace_string_local;
  string *search_string_local;
  string *target_local;
  t_rs_generator *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    psVar2 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::length();
    while (uVar1 = std::__cxx11::string::find((string *)target,(ulong)search_string),
          uVar1 != 0xffffffffffffffff) {
      std::__cxx11::string::replace((ulong)target,uVar1,psVar2);
    }
  }
  return;
}

Assistant:

void t_rs_generator::string_replace(string& target, const string& search_string, const string& replace_string) {
  if (target.empty()) {
    return;
  }

  size_t match_len = search_string.length();
  size_t replace_len = replace_string.length();

  size_t search_idx = 0;
  size_t match_idx;
  while ((match_idx = target.find(search_string, search_idx)) != string::npos) {
    target.replace(match_idx, match_len, replace_string);
    search_idx = match_idx + replace_len;
  }
}